

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AppleII.cpp
# Opt level: O3

void __thiscall
Apple::II::ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true>::flush_output
          (ConcreteMachine<(Analyser::Static::AppleII::Target::Model)3,_true> *this,int outputs)

{
  Cycles CVar1;
  
  update_just_in_time_cards(this);
  if ((outputs & 1U) != 0) {
    CVar1.super_WrappedInt<Cycles>.length_ =
         (WrappedInt<Cycles>)(this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_;
    (this->cycles_since_video_update_).super_WrappedInt<Cycles>.length_ = 0;
    DeferredQueuePerformer<Cycles>::run_for
              (&(this->video_).super_VideoBase.super_VideoSwitches<Cycles>.deferrer_,CVar1);
  }
  if ((outputs & 2U) != 0) {
    CVar1.super_WrappedInt<Cycles>.length_ =
         (WrappedInt<Cycles>)(this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_;
    (this->cycles_since_audio_update_).super_WrappedInt<Cycles>.length_ = 0;
    Outputs::Speaker::
    PullLowpass<Outputs::Speaker::CompoundSource<(anonymous_namespace)::StretchedAYPair,_Audio::Toggle>_>
    ::run_for(&this->speaker_,&this->audio_queue_,CVar1);
    if ((this->audio_queue_).actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_start !=
        (this->audio_queue_).actions_.
        super__Vector_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      std::condition_variable::notify_all();
      return;
    }
  }
  return;
}

Assistant:

void flush_output(int outputs) final {
			update_just_in_time_cards();

			if(outputs & Output::Video) {
				update_video();
			}
			if(outputs & Output::Audio) {
				update_audio();
				audio_queue_.perform();
			}
		}